

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawImage::Tick
          (CommandDrawImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  _func_int **pp_Var1;
  DThinker *pDVar2;
  SBarInfoCommand **ppSVar3;
  long *plVar4;
  APlayerPawn *pAVar5;
  AInventory *pAVar6;
  PClass *p;
  PClassActor *type;
  ulong uVar7;
  FTexture *pFVar8;
  int iVar9;
  AWeapon *item;
  uint uVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  FName local_34;
  
  bVar12 = (this->super_SBarInfoCommandFlowControl).truth;
  uVar7 = (ulong)(this->super_SBarInfoCommandFlowControl).commands[bVar12].
                 super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
  if (uVar7 != 0) {
    ppSVar3 = (this->super_SBarInfoCommandFlowControl).commands[bVar12].
              super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
    lVar11 = 0;
    do {
      plVar4 = *(long **)((long)ppSVar3 + lVar11);
      (**(code **)(*plVar4 + 0x28))(plVar4,block,statusBar,hudChanged);
      lVar11 = lVar11 + 8;
    } while (uVar7 << 3 != lVar11);
  }
  this->texture = (FTexture *)0x0;
  this->alpha = 1.0;
  if (this->applyscale == true) {
    this->spawnScaleX = 1.0;
    this->spawnScaleY = 1.0;
    this->applyscale = false;
  }
  iVar9 = *(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34;
  switch(iVar9) {
  case 0:
    uVar7 = (ulong)(((statusBar->super_DBaseStatusBar).CPlayer)->mo->ScoreIcon).texnum;
    break;
  case 1:
    item = (AWeapon *)statusBar->ammo1;
    goto LAB_004c10e3;
  case 2:
    item = (AWeapon *)statusBar->ammo2;
    goto LAB_004c10e3;
  case 3:
    item = (AWeapon *)statusBar->armor;
    if ((item == (AWeapon *)0x0) || ((item->super_AStateProvider).super_AInventory.Amount == 0))
    goto LAB_004c1115;
    goto LAB_004c10e8;
  case 4:
    item = ((statusBar->super_DBaseStatusBar).CPlayer)->ReadyWeapon;
LAB_004c10e3:
    if (item != (AWeapon *)0x0) {
LAB_004c10e8:
      GetIcon(this,(AInventory *)item);
    }
    goto LAB_004c1115;
  case 5:
    pAVar5 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    local_34.Index = 0x5b;
    p = PClass::FindClass(&local_34);
    type = dyn_cast<PClassActor>((DObject *)p);
    pAVar6 = AActor::FindInventory(&pAVar5->super_AActor,type,false);
    if (pAVar6 == (AInventory *)0x0) goto LAB_004c1115;
    uVar7 = (ulong)(pAVar6->Icon).texnum;
    break;
  case 6:
  case 7:
  case 8:
  case 9:
    pAVar6 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        (PClassActor *)AHexenArmor::RegistrationInfo.MyClass,false);
    if (pAVar6 == (AInventory *)0x0) goto LAB_004c1115;
    uVar10 = iVar9 - 6;
    pp_Var1 = (&pAVar6[1].super_AActor.super_DThinker.super_DObject._vptr_DObject)[uVar10];
    if ((double)pp_Var1 <= 0.0) {
      return;
    }
    pDVar2 = (&pAVar6[1].super_AActor.super_DThinker.NextThinker)[uVar10];
    if ((double)pDVar2 <= 0.0) {
      return;
    }
    dVar13 = (double)pp_Var1 / (double)pDVar2;
    dVar14 = 1.0;
    if (dVar13 <= 1.0) {
      dVar14 = dVar13;
    }
    this->alpha = dVar14 * this->alpha;
    iVar9 = this->image;
    goto LAB_004c110c;
  case 10:
    uVar7 = (ulong)(this->sprite).texnum;
    break;
  default:
    goto switchD_004c0f8d_caseD_b;
  case 0xc:
    pAVar5 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar6 = (pAVar5->InvSel).field_0.p;
    if (pAVar6 != (AInventory *)0x0) {
      if (((pAVar6->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        uVar7 = (ulong)(pAVar6->Icon).texnum;
        break;
      }
      (pAVar5->InvSel).field_0.p = (AInventory *)0x0;
    }
switchD_004c0f8d_caseD_b:
    iVar9 = this->image;
    if (iVar9 < 0) goto LAB_004c1115;
LAB_004c110c:
    pFVar8 = FImageCollection::operator[](&statusBar->Images,iVar9);
    goto LAB_004c1111;
  }
  if (uVar7 < TexMan.Textures.Count) {
    pFVar8 = TexMan.Textures.Array[TexMan.Translation.Array[uVar7]].Texture;
  }
  else {
    pFVar8 = (FTexture *)0x0;
  }
LAB_004c1111:
  this->texture = pFVar8;
LAB_004c1115:
  if ((this->flags & 0x80) != 0) {
    if (this->texture == (FTexture *)0x0) {
      bVar12 = true;
    }
    else {
      bVar12 = this->texture->UseType == '\r';
    }
    if (((this->super_SBarInfoCommandFlowControl).truth != bVar12) &&
       ((this->super_SBarInfoCommandFlowControl).truth = bVar12, block != (SBarInfoMainBlock *)0x0))
    {
      (*(this->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
                (this,block,statusBar,1);
    }
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			texture = NULL;
			alpha = 1.;
			if (applyscale)
			{
				spawnScaleX = spawnScaleY = 1.0f;
				applyscale = false;
			}
			if(type == PLAYERICON)
				texture = TexMan(statusBar->CPlayer->mo->ScoreIcon);
			else if(type == AMMO1)
			{
				AAmmo *ammo = statusBar->ammo1;
				if(ammo != NULL)
					GetIcon(ammo);
			}
			else if(type == AMMO2)
			{
				AAmmo *ammo = statusBar->ammo2;
				if(ammo != NULL)
					GetIcon(ammo);
			}
			else if(type == ARMOR)
			{
				ABasicArmor *armor = statusBar->armor;
				if(armor != NULL && armor->Amount != 0)
					GetIcon(armor);
			}
			else if(type == WEAPONICON)
			{
				AWeapon *weapon = statusBar->CPlayer->ReadyWeapon;
				if(weapon != NULL)
					GetIcon(weapon);
			}
			else if(type == SIGIL)
			{
				AInventory *item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(NAME_Sigil));
				if (item != NULL)
					texture = TexMan(item->Icon);
			}
			else if(type == HEXENARMOR_ARMOR || type == HEXENARMOR_SHIELD || type == HEXENARMOR_HELM || type == HEXENARMOR_AMULET)
			{
				int armorType = type - HEXENARMOR_ARMOR;
			
				AHexenArmor *harmor = statusBar->CPlayer->mo->FindInventory<AHexenArmor>();
				if (harmor != NULL)
				{
					if (harmor->Slots[armorType] > 0 && harmor->SlotsIncrement[armorType] > 0)
					{
						//combine the alpha values
						alpha *= MIN(1., harmor->Slots[armorType] / harmor->SlotsIncrement[armorType]);
						texture = statusBar->Images[image];
					}
					else
						return;
				}
			}
			else if(type == INVENTORYICON)
				texture = TexMan(sprite);
			else if(type == SELECTEDINVENTORYICON && statusBar->CPlayer->mo->InvSel != NULL)
				texture = TexMan(statusBar->CPlayer->mo->InvSel->Icon);
			else if(image >= 0)
				texture = statusBar->Images[image];
			
			if (flags & DI_ALTERNATEONFAIL)
			{
				SetTruth(texture == NULL || texture->UseType == FTexture::TEX_Null, block, statusBar);
			}
		}